

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

string * tchecker::to_string(string *__return_storage_ptr__,clock_constraint_container_t *c,
                            clock_index_t *index)

{
  __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
  local_1c8;
  __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
  local_1c0;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>_>
  local_1b8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  clock_index_t *local_20;
  clock_index_t *index_local;
  clock_constraint_container_t *c_local;
  
  local_20 = index;
  index_local = (clock_index_t *)c;
  c_local = (clock_constraint_container_t *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c0._M_current =
       (clock_constraint_t *)
       std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
       begin((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             index_local);
  local_1c8._M_current =
       (clock_constraint_t *)
       std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::end
                 ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                   *)index_local);
  local_1b8 = make_range<__gnu_cxx::__normal_iterator<tchecker::clock_constraint_t_const*,std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>,__gnu_cxx::__normal_iterator<tchecker::clock_constraint_t_const*,std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>>
                        (&local_1c0,&local_1c8);
  output_clock_constraints<__gnu_cxx::__normal_iterator<tchecker::clock_constraint_t_const*,std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>>
            (local_198,&local_1b8,local_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tchecker::clock_constraint_container_t const & c, tchecker::clock_index_t const & index)
{
  std::stringstream ss;
  tchecker::output_clock_constraints(ss, tchecker::make_range(c.begin(), c.end()), index);
  return ss.str();
}